

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O2

void __thiscall Assimp::LWO::Texture::Texture(Texture *this)

{
  allocator local_1a;
  allocator local_19;
  
  (this->mFileName)._M_dataplus._M_p = (pointer)&(this->mFileName).field_2;
  (this->mFileName)._M_string_length = 0;
  (this->mFileName).field_2._M_local_buf[0] = '\0';
  this->mClipIdx = 0xffffffff;
  this->mStrength = 1.0;
  this->type = 0;
  std::__cxx11::string::string((string *)&this->mUVChannelIndex,"unknown",&local_19);
  this->mRealUVIndex = 0xffffffff;
  this->enabled = true;
  this->blendType = Additive;
  this->bCanUse = true;
  this->mapMode = UV;
  this->majorAxis = AXIS_X;
  this->wrapAmountH = 1.0;
  this->wrapAmountW = 1.0;
  this->wrapModeWidth = REPEAT;
  this->wrapModeHeight = REPEAT;
  std::__cxx11::string::string((string *)&this->ordinal,"",&local_1a);
  return;
}

Assistant:

Texture()
        : mClipIdx(UINT_MAX)
        , mStrength         (1.0f)
        , type()
        , mUVChannelIndex   ("unknown")
        , mRealUVIndex      (UINT_MAX)
        , enabled           (true)
        , blendType         (Additive)
        , bCanUse           (true)
        , mapMode           (UV)
        , majorAxis         (AXIS_X)
        , wrapAmountH       (1.0f)
        , wrapAmountW       (1.0f)
        , wrapModeWidth     (REPEAT)
        , wrapModeHeight    (REPEAT)
        , ordinal           ("\x00")
    {}